

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_stream.hpp
# Opt level: O0

void __thiscall
cfgfile::input_stream_t<cfgfile::string_trait_t>::input_stream_t
          (input_stream_t<cfgfile::string_trait_t> *this,string_t *file_name,istream_t *input)

{
  pos_t pVar1;
  undefined8 in_RDX;
  string *in_RSI;
  undefined8 *in_RDI;
  pos_t in_stack_00000010;
  pos_t *in_stack_00000018;
  pos_t in_stack_00000020;
  buf_t *in_stack_00000028;
  istream_t *in_stack_00000030;
  stack<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::deque<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>_>
  *in_stack_ffffffffffffffb0;
  string *this_00;
  
  *in_RDI = in_RDX;
  in_RDI[1] = 1;
  in_RDI[2] = 1;
  std::
  stack<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,std::deque<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>>>
  ::
  stack<std::deque<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>>,void>
            (in_stack_ffffffffffffffb0);
  this_00 = (string *)(in_RDI + 0xd);
  std::__cxx11::string::string(this_00,in_RSI);
  std::stack<char,std::deque<char,std::allocator<char>>>::
  stack<std::deque<char,std::allocator<char>>,void>
            ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)in_stack_ffffffffffffffb0);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x10fc5b);
  in_RDI[0x1e] = 0;
  in_RDI[0x20] = 0;
  string_trait_t::noskipws((istream_t *)0x10fc7e);
  pVar1 = string_trait_t::size_of_file((istream_t *)this_00);
  in_RDI[0x1f] = pVar1;
  if ((long)in_RDI[0x1f] < 0) {
    in_RDI[0x1f] = 0;
  }
  string_trait_t::fill_buf
            (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018,
             in_stack_00000010);
  return;
}

Assistant:

input_stream_t( const typename Trait::string_t & file_name,
		typename Trait::istream_t & input )
		:	m_stream( input )
		,	m_line_number( 1 )
		,	m_column_number( 1 )
		,	m_file_name( file_name )
		,	m_buf_pos( 0 )
		,	m_stream_pos( 0 )
	{
		Trait::noskipws( m_stream );

		m_stream_size = Trait::size_of_file( m_stream );

		if( m_stream_size < 0 )
			m_stream_size = 0;

		Trait::fill_buf( m_stream, m_buf, c_buff_size, m_stream_pos, m_stream_size );
	}